

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_unlink_check(lyd_node *node)

{
  lysc_node *plVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  
  LVar2 = LY_SUCCESS;
  LVar3 = LY_SUCCESS;
  if ((((node != (lyd_node *)0x0) &&
       (plVar1 = node->schema, LVar3 = LVar2, plVar1 != (lysc_node *)0x0)) &&
      (plVar1->nodetype == 4)) &&
     (((plVar1->flags & 0x100) != 0 && (node->parent != (lyd_node_inner *)0x0)))) {
    LVar3 = LY_EINVAL;
    ly_log(plVar1->module->ctx,LY_LLERR,LY_EINVAL,
           "Cannot unlink a list key \"%s\", unlink the list instance instead.",plVar1->name);
  }
  return LVar3;
}

Assistant:

static LY_ERR
lyd_unlink_check(struct lyd_node *node)
{
    if (!node) {
        return LY_SUCCESS;
    }

    if (lysc_is_key(node->schema) && node->parent) {
        LOGERR(LYD_CTX(node), LY_EINVAL, "Cannot unlink a list key \"%s\", unlink the list instance instead.",
                LYD_NAME(node));
        return LY_EINVAL;
    }

    return LY_SUCCESS;
}